

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::AdjustPartialUncollectedAllocBytes
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep,
          uint expectSweepCount)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 *puVar4;
  code *pcVar5;
  bool bVar6;
  RecyclerSweepManager *this_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 *in_FS_OFFSET;
  
  uVar1 = this->objectCount;
  uVar2 = this->freeCount;
  if (this->lastFreeCount != uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x49a,"(this->lastFreeCount == currentFreeCount)",
                       "this->lastFreeCount == currentFreeCount");
    if (!bVar6) goto LAB_0020ced2;
    *puVar4 = 0;
  }
  uVar3 = this->oldFreeCount;
  this->oldFreeCount = uVar2;
  uVar7 = 0;
  if (expectSweepCount != 0) {
    uVar9 = (uint)uVar3 - (uint)uVar2;
    bVar6 = RecyclerSweep::InPartialCollect(recyclerSweep);
    uVar7 = expectSweepCount;
    if (bVar6) {
      if (uVar9 < expectSweepCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)*in_FS_OFFSET;
        *puVar4 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x4ba,"(newAllocatedCount >= newObjectExpectSweepCount)",
                           "newAllocatedCount >= newObjectExpectSweepCount");
        if (!bVar6) goto LAB_0020ced2;
        *puVar4 = 0;
      }
    }
    else {
      uVar8 = (uint)uVar1 - (uint)uVar2;
      if (uVar8 < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)*in_FS_OFFSET;
        *puVar4 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x4a6,"(allocatedObjectCount >= newAllocatedCount)",
                           "allocatedObjectCount >= newAllocatedCount");
        if (!bVar6) goto LAB_0020ced2;
        *puVar4 = 0;
      }
      uVar7 = 0;
      if ((uVar8 - uVar9 < uVar9) && (uVar7 = expectSweepCount, uVar9 < expectSweepCount)) {
        uVar7 = uVar9;
      }
    }
  }
  if (this->lastUncollectedAllocBytes < this->objectSize * uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4bb,
                       "(this->lastUncollectedAllocBytes >= newObjectExpectSweepCount * this->objectSize)"
                       ,
                       "this->lastUncollectedAllocBytes >= newObjectExpectSweepCount * this->objectSize"
                      );
    if (!bVar6) {
LAB_0020ced2:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar4 = 0;
  }
  this_00 = RecyclerSweep::GetManager(recyclerSweep);
  RecyclerSweepManager::SubtractSweepNewObjectAllocBytes(this_00,(ulong)(uVar7 * this->objectSize));
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::AdjustPartialUncollectedAllocBytes(RecyclerSweep& recyclerSweep, uint const expectSweepCount)
{
    const uint allObjectCount = this->objectCount;
    const ushort currentFreeCount = this->freeCount;
    Assert(this->lastFreeCount == currentFreeCount);

    uint newAllocatedCount = this->oldFreeCount - currentFreeCount;
    this->oldFreeCount = currentFreeCount;

    uint newObjectExpectSweepCount = expectSweepCount;
#if ENABLE_CONCURRENT_GC
    if (expectSweepCount != 0 && !recyclerSweep.InPartialCollect())
    {
        // We don't know which objects that we are going sweep are old and which object are new
        // So just assume one way or the other by the amount of old vs. new object in the block
        const uint allocatedObjectCount = allObjectCount - currentFreeCount;
        Assert(allocatedObjectCount >= newAllocatedCount);
        const uint oldObjectCount = allocatedObjectCount - newAllocatedCount;
        if (oldObjectCount < newAllocatedCount)
        {
            // count all of the swept object as new, but don't exceed the amount we allocated
            if (newObjectExpectSweepCount > newAllocatedCount)
            {
                newObjectExpectSweepCount = newAllocatedCount;
            }
        }
        else
        {
            // count all of the swept object as old
            newObjectExpectSweepCount = 0;
        }
    }
#endif

    // The page can be old, or it is full (where we set lastFreeCount to 0)
    // Otherwise, the newly allocated count must be bigger then the expect sweep count
    Assert(newAllocatedCount >= newObjectExpectSweepCount);
    Assert(this->lastUncollectedAllocBytes >= newObjectExpectSweepCount * this->objectSize);

    recyclerSweep.GetManager()->SubtractSweepNewObjectAllocBytes(newObjectExpectSweepCount * this->objectSize);
}